

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashdyn.c
# Opt level: O0

void tommy_hashdyn_insert
               (tommy_hashdyn *hashdyn,tommy_hashdyn_node *node,void *data,tommy_hash_t hash)

{
  long lVar1;
  long in_FS_OFFSET;
  tommy_count_t pos;
  tommy_hash_t hash_local;
  void *data_local;
  tommy_hashdyn_node *node_local;
  tommy_hashdyn *hashdyn_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  tommy_list_insert_tail(hashdyn->bucket + (hash & hashdyn->bucket_mask),node,data);
  node->key = hash;
  hashdyn->count = hashdyn->count + 1;
  hashdyn_grow_step(hashdyn);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tommy_hashdyn_insert(tommy_hashdyn* hashdyn, tommy_hashdyn_node* node, void* data, tommy_hash_t hash)
{
	tommy_count_t pos = hash & hashdyn->bucket_mask;

	tommy_list_insert_tail(&hashdyn->bucket[pos], node, data);

	node->key = hash;

	++hashdyn->count;

	hashdyn_grow_step(hashdyn);
}